

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O1

void __thiscall
amrex::MLNodeLaplacian::fixUpResidualMask(MLNodeLaplacian *this,int amrlev,iMultiFab *resmsk)

{
  __uniq_ptr_data<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>,_true,_true> this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  MFIter mfi;
  Box local_12c;
  Array4<const_int> local_110;
  Array4<int> local_d0;
  MFIter local_90;
  
  if ((this->super_MLNodeLinOp).m_masks_built == false) {
    MLNodeLinOp::buildMasks(&this->super_MLNodeLinOp);
  }
  this_00.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
  super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
       (this->super_MLNodeLinOp).m_nd_fine_mask.
       super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
       .
       super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[amrlev]._M_t.
       super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
  MFIter::MFIter(&local_90,(FabArrayBase *)resmsk,true);
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      MFIter::tilebox(&local_12c,&local_90);
      FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
                (&local_d0,&resmsk->super_FabArray<amrex::IArrayBox>,&local_90);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                (&local_110,
                 (FabArray<amrex::IArrayBox> *)
                 this_00.
                 super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
                 super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,&local_90);
      if (local_12c.smallend.vect[2] <= local_12c.bigend.vect[2]) {
        iVar1 = local_12c.smallend.vect[2];
        do {
          if (local_12c.smallend.vect[1] <= local_12c.bigend.vect[1]) {
            iVar2 = local_12c.smallend.vect[1];
            do {
              if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                iVar3 = local_12c.smallend.vect[0];
                do {
                  if (local_110.p
                      [((long)iVar2 - (long)local_110.begin.y) * local_110.jstride +
                       (long)(iVar3 - local_110.begin.x) +
                       ((long)iVar1 - (long)local_110.begin.z) * local_110.kstride] == 1) {
                    local_d0.p
                    [((long)iVar2 - (long)local_d0.begin.y) * local_d0.jstride +
                     (long)(iVar3 - local_d0.begin.x) +
                     ((long)iVar1 - (long)local_d0.begin.z) * local_d0.kstride] = 1;
                  }
                  iVar3 = iVar3 + 1;
                } while (local_12c.bigend.vect[0] + 1 != iVar3);
              }
              bVar4 = iVar2 != local_12c.bigend.vect[1];
              iVar2 = iVar2 + 1;
            } while (bVar4);
          }
          bVar4 = iVar1 != local_12c.bigend.vect[2];
          iVar1 = iVar1 + 1;
        } while (bVar4);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MLNodeLaplacian::fixUpResidualMask (int amrlev, iMultiFab& resmsk)
{
    if (!m_masks_built) buildMasks();

    const iMultiFab& cfmask = *m_nd_fine_mask[amrlev];

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(resmsk,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<int> const& rmsk = resmsk.array(mfi);
        Array4<int const> const& fmsk = cfmask.const_array(mfi);
        AMREX_HOST_DEVICE_PARALLEL_FOR_3D ( bx, i, j, k,
        {
            if (fmsk(i,j,k) == crse_fine_node) rmsk(i,j,k) = 1;
        });
    }
}